

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

string * google::protobuf::compiler::cpp::FieldComment<google::protobuf::FieldDescriptor>
                   (string *__return_storage_ptr__,FieldDescriptor *field,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ushort *puVar3;
  char *pcVar4;
  char *pcVar5;
  const_iterator __begin0;
  DebugStringOptions debug_options;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  DebugStringOptions local_5b;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_30;
  
  if (options->strip_nonfunctional_codegen == true) {
    puVar3 = (ushort *)(field->all_names_).payload_;
    pcVar5 = (char *)((long)puVar3 + ~(ulong)*puVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (char *)((long)puVar3 + -1);
  }
  else {
    local_5b.include_comments = false;
    local_5b.elide_group_body = true;
    local_5b.elide_oneof_body = true;
    FieldDescriptor::DebugStringWithOptions_abi_cxx11_(&local_30,field,&local_5b);
    local_58.text_._M_string_length = local_30._M_string_length;
    paVar1 = &local_30.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == paVar1) {
      local_90.curr_._M_str = (char *)local_30.field_2._8_8_;
      local_90.pos_ = (size_t)&local_90.curr_;
    }
    else {
      local_90.pos_ = (size_t)local_30._M_dataplus._M_p;
    }
    local_90.curr_._M_len =
         CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_58.text_.field_2;
    if ((string_view *)local_90.pos_ == &local_90.curr_) {
      local_58.text_.field_2._8_8_ = local_90.curr_._M_str;
      local_58.text_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_58.text_._M_dataplus._M_p = (pointer)local_90.pos_;
    }
    local_58.text_.field_2._M_allocated_capacity = local_90.curr_._M_len;
    local_90.splitter_ = &local_58;
    local_58.delimiter_.c_ = '\n';
    local_90.pos_ = 0;
    local_90._8_8_ = local_58.text_._M_string_length & 0xffffffff00000000;
    local_90.curr_._M_len = 0;
    local_90.curr_._M_str = (char *)0x0;
    local_90.delimiter_.c_ = '\n';
    local_30._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.text_._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_90._12_4_ = SUB84(local_58.text_._M_string_length >> 0x20,0);
      local_90.state_ = 2;
      local_90.pos_ = local_58.text_._M_string_length;
    }
    else {
      absl::lts_20250127::strings_internal::
      SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_90);
    }
    if ((local_90.state_ != kEndState) || (local_90.pos_ != local_58.text_._M_string_length)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_90.curr_._M_str,
                 local_90.curr_._M_str + local_90.curr_._M_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.text_._M_dataplus._M_p == paVar2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_58.text_._M_dataplus._M_p,
                      local_58.text_.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.text_._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.text_._M_dataplus._M_p,
                      local_58.text_.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "<unknown>";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldComment(const T* field, const Options& options) {
  if (options.strip_nonfunctional_codegen) {
    return std::string(field->name());
  }
  // Print the field's (or oneof's) proto-syntax definition as a comment.
  // We don't want to print group bodies so we cut off after the first
  // line.
  DebugStringOptions debug_options;
  debug_options.elide_group_body = true;
  debug_options.elide_oneof_body = true;

  for (absl::string_view chunk :
       absl::StrSplit(field->DebugStringWithOptions(debug_options), '\n')) {
    return std::string(chunk);
  }

  return "<unknown>";
}